

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<ProString,char[8]>
                    (QList<ProString> *vector,char (*u) [8],qsizetype from)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ProString *this;
  
  uVar1 = (vector->d).size;
  uVar4 = from;
  if (from < 0) {
    uVar4 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar4 = 0;
    }
  }
  lVar3 = -1;
  if (uVar4 < uVar1) {
    this = (vector->d).ptr + uVar4;
    lVar5 = uVar1 * 0x30 + uVar4 * -0x30;
    lVar3 = 0x30 - (long)this;
    do {
      lVar6 = lVar3;
      if (lVar5 == 0) {
        return -1;
      }
      bVar2 = ProString::operator==(this,*u);
      this = this + 1;
      lVar5 = lVar5 + -0x30;
      lVar3 = lVar6 + -0x30;
    } while (!bVar2);
    lVar3 = -((long)&(vector->d).ptr[-1].m_string.d.d + lVar6) / 0x30;
  }
  return lVar3;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}